

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double calc_kurtosis<double,double>
                 (size_t *ix_arr,size_t st,size_t end,double *x,MissingAction missing_action)

{
  long lVar1;
  size_t *psVar2;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double local_38;
  
  if (missing_action != Fail) {
    if (end < st) {
      return -INFINITY;
    }
    dVar21 = 0.0;
    dVar14 = 0.0;
    dVar15 = 0.0;
    local_38 = 0.0;
    sVar4 = st;
    lVar5 = 0;
    do {
      lVar7 = lVar5;
      if ((ulong)ABS(x[ix_arr[sVar4]]) < 0x7ff0000000000000) {
        lVar7 = lVar5 + 1;
        auVar23._8_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar23._0_8_ = lVar7;
        auVar23._12_4_ = 0x45300000;
        dVar16 = (auVar23._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
        dVar18 = x[ix_arr[sVar4]] - dVar15;
        dVar17 = dVar18 / dVar16;
        auVar20._8_4_ = (int)((ulong)lVar5 >> 0x20);
        auVar20._0_8_ = lVar5;
        auVar20._12_4_ = 0x45300000;
        dVar18 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * dVar17 * dVar18;
        dVar21 = dVar21 + dVar17 * -4.0 * dVar14 +
                          dVar17 * dVar17 * 6.0 * local_38 +
                          (dVar16 * dVar16 + dVar16 * -3.0 + 3.0) * dVar17 * dVar17 * dVar18;
        dVar15 = dVar15 + dVar17;
        dVar14 = dVar14 + dVar17 * -3.0 * local_38 + (dVar16 + -2.0) * dVar17 * dVar18;
        local_38 = local_38 + dVar18;
      }
      sVar4 = sVar4 + 1;
      lVar5 = lVar7;
    } while (sVar4 <= end);
    if (lVar7 == 0) {
      return -INFINITY;
    }
    if (((!NAN(local_38)) &&
        ((uint)((long)ABS(local_38) + 0xfff0000000000000U >> 0x35) < 0x3ff && (long)local_38 < 0 ||
         (ABS(local_38) == 0.0 || (long)ABS(local_38) - 1U < 0xfffffffffffff && (long)local_38 < 0))
        ) && (bVar3 = check_more_than_two_unique_values<double>(ix_arr,st,end,x,missing_action),
             !bVar3)) {
      return -INFINITY;
    }
    auVar8._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar8._0_8_ = lVar7;
    auVar8._12_4_ = 0x45300000;
    auVar22._8_8_ =
         (auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
    auVar22._0_8_ = dVar21;
    auVar11._8_8_ = local_38;
    auVar11._0_8_ = local_38;
    auVar23 = divpd(auVar22,auVar11);
    dVar14 = auVar23._8_8_ * auVar23._0_8_;
    if (0x7fefffffffffffff < (long)ABS(dVar14)) {
      return -INFINITY;
    }
    goto LAB_00164999;
  }
  dVar15 = 0.0;
  dVar14 = 0.0;
  if (end < st) {
LAB_001648dc:
    dVar21 = ABS(dVar14);
    if ((uint)((long)dVar21 + 0xfff0000000000000U >> 0x35) < 0x3ff && (long)dVar14 < 0 ||
        (dVar21 == 0.0 || (long)dVar21 - 1U < 0xfffffffffffff && (long)dVar14 < 0)) {
      if (end - st < 2) {
        return -INFINITY;
      }
      uVar6 = st + 1;
      do {
        if (end < uVar6) {
          return -INFINITY;
        }
        psVar2 = ix_arr + uVar6;
        uVar6 = uVar6 + 1;
      } while ((x[*psVar2] == x[ix_arr[st]]) && (!NAN(x[*psVar2]) && !NAN(x[ix_arr[st]])));
    }
  }
  else {
    dVar21 = 0.0;
    dVar16 = 0.0;
    lVar5 = 0;
    dVar14 = 0.0;
    do {
      lVar7 = lVar5 + 1;
      auVar9._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar9._0_8_ = lVar7;
      auVar9._12_4_ = 0x45300000;
      dVar18 = (auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
      dVar19 = (x[ix_arr[st + lVar5]] - dVar16) / dVar18;
      auVar24._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar24._0_8_ = lVar5;
      auVar24._12_4_ = 0x45300000;
      dVar17 = ((auVar24._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * dVar19 *
               (x[ix_arr[st + lVar5]] - dVar16);
      dVar15 = dVar15 + dVar19 * -4.0 * dVar21 +
                        dVar19 * dVar19 * 6.0 * dVar14 +
                        (dVar18 * dVar18 + dVar18 * -3.0 + 3.0) * dVar19 * dVar19 * dVar17;
      dVar16 = dVar16 + dVar19;
      dVar21 = dVar21 + dVar19 * -3.0 * dVar14 + (dVar18 + -2.0) * dVar19 * dVar17;
      dVar14 = dVar17 + dVar14;
      lVar1 = st + lVar5;
      lVar5 = lVar7;
    } while (lVar1 + 1U <= end);
    if (!NAN(dVar14)) goto LAB_001648dc;
  }
  lVar5 = (end - st) + 1;
  auVar12._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar12._0_8_ = lVar5;
  auVar12._12_4_ = 0x45300000;
  auVar13._0_8_ =
       (auVar12._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
  auVar13._8_8_ = dVar15;
  auVar10._8_8_ = dVar14;
  auVar10._0_8_ = dVar14;
  auVar23 = divpd(auVar13,auVar10);
  dVar14 = auVar23._8_8_ * auVar23._0_8_;
  if (0x7fefffffffffffff < (long)ABS(dVar14)) {
    return -INFINITY;
  }
LAB_00164999:
  if (dVar14 <= 0.0) {
    return 0.0;
  }
  return dVar14;
}

Assistant:

double calc_kurtosis(size_t ix_arr[], size_t st, size_t end, real_t x[], MissingAction missing_action)
{
    ldouble_safe m = 0;
    ldouble_safe M2 = 0, M3 = 0, M4 = 0;
    ldouble_safe delta, delta_s, delta_div;
    ldouble_safe diff, n;
    ldouble_safe out;

    if (missing_action == Fail)
    {
        for (size_t row = st; row <= end; row++)
        {
            n  =  (ldouble_safe)(row - st + 1);

            delta      =  x[ix_arr[row]] - m;
            delta_div  =  delta / n;
            delta_s    =  delta_div * delta_div;
            diff       =  delta * (delta_div * (ldouble_safe)(row - st));

            m   +=  delta_div;
            M4  +=  diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3;
            M3  +=  diff * delta_div * (n - 2) - 3 * delta_div * M2;
            M2  +=  diff;
        }

        if (unlikely(!is_na_or_inf(M2) && M2 <= 0))
        {
            if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
                return -HUGE_VAL;
        }

        out = ( M4 / M2 ) * ( (ldouble_safe)(end - st + 1) / M2 );
        return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
    }

    else
    {
        size_t cnt = 0;
        for (size_t row = st; row <= end; row++)
        {
            if (likely(!is_na_or_inf(x[ix_arr[row]])))
            {
                cnt++;
                n = (ldouble_safe) cnt;

                delta      =  x[ix_arr[row]] - m;
                delta_div  =  delta / n;
                delta_s    =  delta_div * delta_div;
                diff       =  delta * (delta_div * (ldouble_safe)(cnt - 1));

                m   +=  delta_div;
                M4  +=  diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3;
                M3  +=  diff * delta_div * (n - 2) - 3 * delta_div * M2;
                M2  +=  diff;
            }
        }

        if (unlikely(cnt == 0)) return -HUGE_VAL;
        if (unlikely(!is_na_or_inf(M2) && M2 <= 0))
        {
            if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
                return -HUGE_VAL;
        }

        out = ( M4 / M2 ) * ( (ldouble_safe)cnt / M2 );
        return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
    }
}